

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

stumpless_target *
stumpless_set_sqlite3_prepare
          (stumpless_target *target,stumpless_sqlite3_prepare_func_t preparer,void *data)

{
  stumpless_id_t pvVar1;
  sqlite3_target *db_target;
  void *data_local;
  stumpless_sqlite3_prepare_func_t preparer_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if (preparer == (stumpless_sqlite3_prepare_func_t)0x0) {
    raise_argument_empty("preparer was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    pvVar1 = target->id;
    pthread_lock_mutex((pthread_mutex_t *)((long)pvVar1 + 0x28));
    *(stumpless_sqlite3_prepare_func_t *)((long)pvVar1 + 0x10) = preparer;
    *(void **)((long)pvVar1 + 0x18) = data;
    pthread_unlock_mutex((pthread_mutex_t *)((long)pvVar1 + 0x28));
    target_local = target;
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_sqlite3_prepare( struct stumpless_target *target,
                               stumpless_sqlite3_prepare_func_t preparer,
                               void *data ) {
  struct sqlite3_target *db_target;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( preparer );

  db_target = target->id;

  config_lock_mutex( &db_target->db_mutex );
  db_target->prepare_func = preparer;
  db_target->prepare_data = data;
  config_unlock_mutex( &db_target->db_mutex );

  return target;
}